

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  Config *pCVar1;
  Module *pMVar2;
  Name name;
  Name name_00;
  Name name_01;
  bool bVar3;
  pointer ppVar4;
  Export *pEVar5;
  mapped_type *this_00;
  Function *pFVar6;
  pointer pFVar7;
  Name value;
  Name name_02;
  Name name_03;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_1a8;
  ModuleSplitter *local_188;
  size_t sStack_180;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_170;
  ModuleSplitter *local_168;
  HeapType HStack_160;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_150;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string_view local_d0;
  string_view local_c0;
  _Base_ptr local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Name local_50;
  _Self local_40;
  _Self local_38;
  iterator exportIt;
  Name exportName;
  ModuleSplitter *this_local;
  Name funcName_local;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  this_local = funcName.super_IString.str._M_len;
  wasm::Name::Name((Name *)&exportIt);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::find(&this->exportedPrimaryFuncs,(key_type *)&this_local);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end(&this->exportedPrimaryFuncs);
  bVar3 = std::operator!=(&local_38,&local_40);
  if (bVar3) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Name>_>::operator->(&local_38)
    ;
    wasm::Name::operator=((Name *)&exportIt,&ppVar4->second);
  }
  else {
    if ((this->config->minimizeNewExportNames & 1U) == 0) {
      pCVar1 = this->config;
      pMVar2 = this->primary;
      IString::toString_abi_cxx11_(&local_110,(IString *)&this_local);
      std::operator+(&local_f0,&pCVar1->newExportPrefix,&local_110);
      wasm::Name::Name((Name *)&local_d0,&local_f0);
      local_c0 = (string_view)Names::getValidExportName(pMVar2,(Name)local_d0);
      wasm::Name::operator=((Name *)&exportIt,(Name *)&local_c0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      do {
        pCVar1 = this->config;
        Names::MinifiedNameGenerator::getName_abi_cxx11_(&local_90,&this->minified);
        std::operator+(&local_70,&pCVar1->newExportPrefix,&local_90);
        wasm::Name::Name(&local_50,&local_70);
        wasm::Name::operator=((Name *)&exportIt,&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        local_b0 = exportIt._M_node;
        name_01.super_IString.str._M_str = (char *)exportName.super_IString.str._M_len;
        name_01.super_IString.str._M_len = (size_t)exportIt._M_node;
        pEVar5 = Module::getExportOrNull(this->primary,name_01);
      } while (pEVar5 != (Export *)0x0);
    }
    pMVar2 = this->primary;
    value.super_IString.str._M_str = (char *)this_local;
    value.super_IString.str._M_len = exportName.super_IString.str._M_len;
    name_02.super_IString.str._M_str = (char *)exportIt._M_node;
    name_02.super_IString.str._M_len = (size_t)&local_118;
    Builder::makeExport(name_02,value,(ExternalKind)funcName_local.super_IString.str._M_len);
    Module::addExport(pMVar2,&local_118);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_118);
    this_00 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::operator[](&this->exportedPrimaryFuncs,(key_type *)&this_local);
    wasm::Name::operator=(this_00,(Name *)&exportIt);
  }
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this_local;
  name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)this_local;
  pFVar6 = Module::getFunctionOrNull(this->secondary,name_00);
  if (pFVar6 == (Function *)0x0) {
    local_168 = this_local;
    HStack_160.id = funcName_local.super_IString.str._M_len;
    local_188 = this_local;
    sStack_180 = funcName_local.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    pFVar6 = Module::getFunction(this->primary,name);
    local_170 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar6->type).id;
    local_1a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_1a8);
    name_03.super_IString.str._M_str = (char *)local_168;
    name_03.super_IString.str._M_len = (size_t)&local_150;
    Builder::makeFunction(name_03,HStack_160,local_170,(Expression *)&local_1a8);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_1a8);
    pCVar1 = this->config;
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_150);
    wasm::Name::operator=(&(pFVar7->super_Importable).module,&pCVar1->importNamespace);
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_150);
    wasm::Name::operator=(&(pFVar7->super_Importable).base,(Name *)&exportIt);
    Module::addFunction(this->secondary,&local_150);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_150);
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto func =
      Builder::makeFunction(funcName, primary.getFunction(funcName)->type, {});
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}